

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_135f2b2::ObmcSadHBDTest_ExtremeValues_Test::TestBody
          (ObmcSadHBDTest_ExtremeValues_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  char *in_RDI;
  AssertionResult gtest_ar;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  uint tst_res;
  uint ref_res;
  int i;
  int pre_stride;
  int iter;
  int32_t mask [16384];
  int32_t wsrc [16384];
  uint16_t pre [16384];
  AssertHelper *in_stack_fffffffffffd7f28;
  uint *in_stack_fffffffffffd7f30;
  char *in_stack_fffffffffffd7f38;
  uint in_stack_fffffffffffd7f44;
  Type in_stack_fffffffffffd7f54;
  uint uVar3;
  AssertHelper *in_stack_fffffffffffd7f58;
  AssertionResult aAStack_28098 [2];
  undefined1 auStack_28072 [18];
  Message *in_stack_fffffffffffd7fa0;
  undefined4 in_stack_fffffffffffd7fa8;
  undefined4 uVar4;
  int iStack_2804c;
  int iStack_28044;
  undefined4 auStack_28040 [16384];
  undefined4 auStack_18040 [16384];
  undefined2 local_8040 [16412];
  
  iStack_28044 = 0;
  while( true ) {
    in_stack_fffffffffffd7f44 = in_stack_fffffffffffd7f44 & 0xffffff;
    if (iStack_28044 < 0x80) {
      bVar1 = testing::Test::HasFatalFailure();
      in_stack_fffffffffffd7f44 = CONCAT13(bVar1,(int3)in_stack_fffffffffffd7f44) ^ 0xff000000;
    }
    if ((in_stack_fffffffffffd7f44 & 0x1000000) == 0) {
      return;
    }
    for (iStack_2804c = 0; iStack_2804c < 0x4000; iStack_2804c = iStack_2804c + 1) {
      local_8040[iStack_2804c] = 0xfff;
      auStack_18040[iStack_2804c] = 0xfff000;
      auStack_28040[iStack_2804c] = 0x1000;
    }
    (**(code **)(in_RDI + 0x20))((ulong)local_8040 >> 1,iStack_28044,auStack_18040,auStack_28040);
    libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX
              ((RegisterStateCheckMMX *)&aAStack_28098[2].field_0x6);
    uVar2 = (**(code **)(in_RDI + 0x28))
                      ((ulong)local_8040 >> 1,iStack_28044,auStack_18040,auStack_28040);
    uVar4 = uVar2;
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xbd3a01);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffd7f44,uVar2),in_stack_fffffffffffd7f38,
               in_stack_fffffffffffd7f30,(uint *)in_stack_fffffffffffd7f28);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(aAStack_28098);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffd7f58);
      in_stack_fffffffffffd7f38 =
           testing::AssertionResult::failure_message((AssertionResult *)0xbd3a71);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffd7f58,in_stack_fffffffffffd7f54,in_RDI,
                 in_stack_fffffffffffd7f44,in_stack_fffffffffffd7f38);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(uVar4,in_stack_fffffffffffd7fa8),in_stack_fffffffffffd7fa0
                );
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffd7f28);
      testing::Message::~Message((Message *)0xbd3abf);
    }
    uVar3 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd3b1f);
    if (uVar3 != 0) break;
    iStack_28044 = iStack_28044 + 1;
    in_stack_fffffffffffd7f54 = kSuccess;
  }
  return;
}

Assistant:

TEST_P(ObmcSadHBDTest, ExtremeValues) {
  DECLARE_ALIGNED(32, uint16_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  for (int iter = 0; iter < MAX_SB_SIZE && !HasFatalFailure(); ++iter) {
    const int pre_stride = iter;

    for (int i = 0; i < MAX_SB_SQUARE; ++i) {
      pre[i] = (1 << 12) - 1;
      wsrc[i] = ((1 << 12) - 1) * kMaskMax * kMaskMax;
      mask[i] = kMaskMax * kMaskMax;
    }

    const unsigned int ref_res =
        params_.ref_func(CONVERT_TO_BYTEPTR(pre), pre_stride, wsrc, mask);
    unsigned int tst_res;
    API_REGISTER_STATE_CHECK(
        tst_res =
            params_.tst_func(CONVERT_TO_BYTEPTR(pre), pre_stride, wsrc, mask));

    ASSERT_EQ(ref_res, tst_res);
  }
}